

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

TValue * index2adr(lua_State *L,int idx)

{
  GCObject *pGVar1;
  TValue *pTVar2;
  
  if (0 < idx) {
    pTVar2 = &luaO_nilobject_;
    if (L->base + ((ulong)(uint)idx - 1) < L->top) {
      pTVar2 = L->base + ((ulong)(uint)idx - 1);
    }
    return pTVar2;
  }
  if (-10000 < idx) {
    return L->top + idx;
  }
  if (idx == -0x2712) {
    return &L->l_gt;
  }
  if (idx != -0x2711) {
    if (idx == -10000) {
      return &L->l_G->l_registry;
    }
    pGVar1 = (L->ci->func->value).gc;
    pTVar2 = &luaO_nilobject_;
    if (-0x2712 - idx <= (int)(uint)(pGVar1->h).lsizenode) {
      pTVar2 = (TValue *)((long)pGVar1 + (long)(-0x2713 - idx) * 0x10 + 0x28);
    }
    return pTVar2;
  }
  (L->env).value = (Value)(((L->ci->func->value).gc)->h).array;
  (L->env).tt = 5;
  return &L->env;
}

Assistant:

static TValue*index2adr(lua_State*L,int idx){
if(idx>0){
TValue*o=L->base+(idx-1);
luai_apicheck(L,idx<=L->ci->top-L->base);
if(o>=L->top)return cast(TValue*,(&luaO_nilobject_));
else return o;
}
else if(idx>(-10000)){
luai_apicheck(L,idx!=0&&-idx<=L->top-L->base);
return L->top+idx;
}
else switch(idx){
case(-10000):return registry(L);
case(-10001):{
Closure*func=curr_func(L);
sethvalue(L,&L->env,func->c.env);
return&L->env;
}
case(-10002):return gt(L);
default:{
Closure*func=curr_func(L);
idx=(-10002)-idx;
return(idx<=func->c.nupvalues)
?&func->c.upvalue[idx-1]
:cast(TValue*,(&luaO_nilobject_));
}
}
}